

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

bool Fixpp::impl::TagMatcher<Fixpp::Type::Int>::matchValue(Return *value,StreamCursor *cursor)

{
  bool bVar1;
  int local_24;
  StreamCursor *pSStack_20;
  int val;
  StreamCursor *cursor_local;
  Return *value_local;
  
  pSStack_20 = cursor;
  cursor_local = (StreamCursor *)value;
  bVar1 = match_int_fast(&local_24,cursor);
  if (bVar1) {
    *(int *)&cursor_local->buf = local_24;
  }
  return bVar1;
}

Assistant:

static bool matchValue(Return* value, StreamCursor& cursor)
            {
                int val;
                if (!match_int_fast(&val, cursor)) return false;

                *value = val;
                return true;
            }